

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall SGParser::Generator::RegExprDFANode::Setup(RegExprDFANode *this)

{
  size_type sVar1;
  size_type sVar2;
  iterator iVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  reference ppRVar8;
  byte local_c9;
  byte local_b1;
  RegExprDFANode *this_local;
  
  switch(this->Type) {
  case Epsilon:
    this->Nullable = true;
    break;
  case And:
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    local_c9 = 0;
    if (((*ppRVar8)->Nullable & 1U) != 0) {
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      local_c9 = (*ppRVar8)->Nullable;
    }
    this->Nullable = (bool)(local_c9 & 1);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    if (((*ppRVar8)->Nullable & 1U) == 0) {
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->FirstPos,&(*ppRVar8)->FirstPos);
    }
    else {
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(*ppRVar8)->FirstPos);
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(*ppRVar8)->FirstPos);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                (&this->FirstPos,sVar1 + sVar2);
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      iVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&(*ppRVar8)->FirstPos)
      ;
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&(*ppRVar8)->FirstPos);
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&(*ppRVar8)->FirstPos)
      ;
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      iVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&(*ppRVar8)->FirstPos);
      iVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->FirstPos);
      std::
      merge<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar3._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar4._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar5._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar6._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar7._M_current);
    }
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,1);
    if (((*ppRVar8)->Nullable & 1U) == 0) {
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                (&this->LastPos,&(*ppRVar8)->FirstPos);
    }
    else {
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(*ppRVar8)->FirstPos);
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(*ppRVar8)->FirstPos);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->LastPos,sVar1 + sVar2)
      ;
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      iVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&(*ppRVar8)->FirstPos)
      ;
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,0);
      iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&(*ppRVar8)->FirstPos);
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&(*ppRVar8)->FirstPos)
      ;
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      iVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&(*ppRVar8)->FirstPos);
      iVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->LastPos);
      std::
      merge<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar3._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar4._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar5._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar6._M_current,
                 (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  )iVar7._M_current);
    }
    break;
  case Or:
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    local_b1 = 0;
    if (((*ppRVar8)->Nullable & 1U) != 0) {
      ppRVar8 = std::
                vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
                ::operator[](&this->Children,1);
      local_b1 = (*ppRVar8)->Nullable;
    }
    this->Nullable = (bool)(local_b1 & 1);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(*ppRVar8)->FirstPos);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,1);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&(*ppRVar8)->FirstPos);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->FirstPos,sVar1 + sVar2);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    iVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&(*ppRVar8)->FirstPos);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    iVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&(*ppRVar8)->FirstPos);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,1);
    iVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&(*ppRVar8)->FirstPos);
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,1);
    iVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&(*ppRVar8)->FirstPos);
    iVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->FirstPos);
    std::
    merge<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar3._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar4._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar5._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar6._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )iVar7._M_current);
    break;
  case Star:
    this->Nullable = true;
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->FirstPos,&(*ppRVar8)->FirstPos);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->LastPos,&this->FirstPos);
    break;
  case Plus:
    this->Nullable = false;
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->FirstPos,&(*ppRVar8)->FirstPos);
    break;
  case Question:
    this->Nullable = true;
    ppRVar8 = std::
              vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
              ::operator[](&this->Children,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->FirstPos,&(*ppRVar8)->FirstPos);
    break;
  case Char:
    this->Nullable = false;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->FirstPos,&this->Position);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              (&this->LastPos,&this->FirstPos);
  }
  return;
}

Assistant:

void Setup() {
        switch (Type) {
            case NodeType::Epsilon:
                Nullable = true;
                break;

            case NodeType::Char:
                Nullable = false;
                FirstPos.push_back(Position);
                LastPos = FirstPos;
                break;

            case NodeType::Or:
                Nullable = Children[0u]->Nullable && Children[1u]->Nullable;
                FirstPos.resize(Children[0u]->FirstPos.size() + Children[1u]->FirstPos.size());
                std::merge(Children[0u]->FirstPos.begin(), Children[0u]->FirstPos.end(),
                           Children[1u]->FirstPos.begin(), Children[1u]->FirstPos.end(),
                           FirstPos.begin());
                break;

            case NodeType::And:
                // Nullable
                Nullable = Children[0u]->Nullable && Children[1u]->Nullable;
                // FirstPos
                if (Children[0u]->Nullable) {
                    FirstPos.resize(Children[0u]->FirstPos.size() + Children[1u]->FirstPos.size());
                    std::merge(Children[0u]->FirstPos.begin(), Children[0u]->FirstPos.end(),
                               Children[1u]->FirstPos.begin(), Children[1u]->FirstPos.end(),
                               FirstPos.begin());
                } else
                    FirstPos = Children[0u]->FirstPos;
                // LastPos
                if (Children[1u]->Nullable) {
                    LastPos.resize(Children[0u]->FirstPos.size() + Children[1u]->FirstPos.size());
                    std::merge(Children[0u]->FirstPos.begin(), Children[0u]->FirstPos.end(),
                               Children[1u]->FirstPos.begin(), Children[1u]->FirstPos.end(),
                               LastPos.begin());
                } else
                    LastPos = Children[1u]->FirstPos;
                break;

            case NodeType::Star:
                Nullable = true;
                FirstPos = Children[0u]->FirstPos;
                LastPos  = FirstPos;
                break;

            case NodeType::Question:
                Nullable = true;
                FirstPos = Children[0u]->FirstPos;
                break;

            case NodeType::Plus:
                Nullable = false;
                FirstPos = Children[0u]->FirstPos;
                break;

            default:
                break;
        }
    }